

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf256.c
# Opt level: O0

_Bool test_add(void)

{
  uint8_t uVar1;
  
  uVar1 = gf256_add('\x01','\x01');
  if (((uVar1 == '\0') && (uVar1 = gf256_add(0x85,0x85), uVar1 == '\0')) &&
     (uVar1 = gf256_add('5','{'), uVar1 == 'N')) {
    return true;
  }
  return false;
}

Assistant:

static bool test_add()
{
	if (gf256_add(1,1) != 0
		|| gf256_add(133, 133) != 0
		|| gf256_add(53, 123) != 78)
	{
		return false;
	}
	return true;
}